

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

void addnum2buff(BuffFS *buff,TValue *num)

{
  int iVar1;
  char *buff_00;
  
  buff_00 = getbuff(buff,0x2c);
  iVar1 = tostringbuff(num,buff_00);
  buff->blen = buff->blen + iVar1;
  return;
}

Assistant:

static void addnum2buff (BuffFS *buff, TValue *num) {
  char *numbuff = getbuff(buff, MAXNUMBER2STR);
  int len = tostringbuff(num, numbuff);  /* format number into 'numbuff' */
  addsize(buff, len);
}